

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall ipx::IPM::StartingPoint(IPM *this,KKTSolver *kkt,Iterate *iterate,Info *info)

{
  int iVar1;
  ipxint iVar2;
  
  this->kkt_ = kkt;
  this->iterate_ = iterate;
  this->info_ = info;
  PrintHeader(this);
  ComputeStartingPoint(this);
  if ((info->super_ipx_info).errflag == 0) {
    PrintOutput(this);
  }
  iVar1 = (info->super_ipx_info).errflag;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else if (iVar1 == 999) {
    (info->super_ipx_info).errflag = 0;
    iVar2 = 6;
  }
  else {
    iVar2 = 9;
    if (iVar1 == 0x3e6) {
      (info->super_ipx_info).errflag = 0;
      iVar2 = 5;
    }
  }
  (info->super_ipx_info).status_ipm = iVar2;
  return;
}

Assistant:

void IPM::StartingPoint(KKTSolver* kkt, Iterate* iterate, Info* info) {
    kkt_ = kkt;
    iterate_ = iterate;
    info_ = info;
    PrintHeader();
    ComputeStartingPoint();
    if (info->errflag == 0)
        PrintOutput();
    // Set status_ipm.
    if (info->errflag == IPX_ERROR_user_interrupt) {
        info->errflag = 0;
        info->status_ipm = IPX_STATUS_user_interrupt;
    } else if (info->errflag == IPX_ERROR_time_interrupt) {
        info->errflag = 0;
        info->status_ipm = IPX_STATUS_time_limit;
    } else if (info->errflag) {
        info->status_ipm = IPX_STATUS_failed;
    } else {
        info->status_ipm = IPX_STATUS_not_run;
    }
}